

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O0

void __thiscall Rml::DecoratorRadialGradient::DecoratorRadialGradient(DecoratorRadialGradient *this)

{
  DecoratorRadialGradient *this_local;
  
  Decorator::Decorator(&this->super_Decorator);
  (this->super_Decorator)._vptr_Decorator = (_func_int **)&PTR__DecoratorRadialGradient_008159e8;
  this->repeating = false;
  this->shape = Circle;
  this->size_type = ClosestSide;
  Vector2<Rml::NumericValue>::Vector2(&this->size);
  Vector2<Rml::NumericValue>::Vector2(&this->position);
  ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::vector(&this->color_stops);
  return;
}

Assistant:

DecoratorRadialGradient::DecoratorRadialGradient() {}